

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem local_40;
  long local_38;
  long local_30;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetOrder",&local_40);
  if (iVar1 == 0) {
    iVar1 = 3;
    if (0 < ord) {
      iVar1 = ord;
    }
    local_40->q = iVar1;
    iVar1 = 0;
    local_40->p = 0;
    local_40->stages = 0;
    MRIStepCoupling_Space(local_40->MRIC,&local_38,&local_30);
    MRIStepCoupling_Free(local_40->MRIC);
    local_40->MRIC = (MRIStepCoupling)0x0;
    ark_mem->liw = ark_mem->liw - local_38;
    ark_mem->lrw = ark_mem->lrw - local_30;
  }
  return iVar1;
}

Assistant:

int mriStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  int retval;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval) { return (retval); }

  /* check for illegal inputs */
  if (ord <= 0) { step_mem->q = 3; }
  else { step_mem->q = ord; }

  /* Clear tables, the user is requesting a change in method or a reset to
     defaults. Tables will be set in InitialSetup. */
  step_mem->stages = 0;
  step_mem->p      = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  return (ARK_SUCCESS);
}